

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontStructMatrix.cpp
# Opt level: O0

void __thiscall
TPZFrontStructMatrix<TPZFrontNonSym<double>,_double,_TPZStructMatrixOR<double>_>::Assemble
          (TPZFrontStructMatrix<TPZFrontNonSym<double>,_double,_TPZStructMatrixOR<double>_> *this,
          TPZBaseMatrix *stiff_base,TPZBaseMatrix *rhs_base,
          TPZAutoPointer<TPZGuiInterface> *guiInterface)

{
  TPZCompEl *pTVar1;
  bool bVar2;
  TPZFrontStructMatrix<TPZFrontNonSym<double>,_double,_TPZStructMatrixOR<double>_> *this_00;
  TPZCompEl *el_00;
  TPZElementMatrix *ekb;
  TPZElementMatrix *efb;
  void *this_01;
  ostream *poVar3;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  int matid;
  TPZMaterial *mat;
  TPZCompEl *el;
  int64_t elindex;
  TPZVec<int> elorder;
  TPZAdmChunkVector<TPZCompEl_*,_10> *elementvec;
  TPZElementMatrixT<double> ef;
  TPZElementMatrixT<double> ek;
  int64_t nelem;
  int64_t numel;
  int64_t iel;
  TPZFMatrix<double> *rhs;
  TPZMatrix<double> *stiffness;
  TPZElementMatrixT<double> *in_stack_ffffffffffff7850;
  int64_t in_stack_ffffffffffff7858;
  TPZVec<int> *in_stack_ffffffffffff7860;
  TPZFMatrix<double> *in_stack_ffffffffffff7868;
  undefined4 in_stack_ffffffffffff7870;
  int in_stack_ffffffffffff7874;
  TPZCompMesh *in_stack_ffffffffffff7880;
  TPZCompMesh *in_stack_ffffffffffff7888;
  TPZElementMatrixT<double> *in_stack_ffffffffffff7890;
  long local_8750;
  long local_8740;
  undefined1 local_86c8 [664];
  TPZFrontStructMatrix<TPZFrontNonSym<double>,_double,_TPZStructMatrixOR<double>_>
  *in_stack_ffffffffffff7bd0;
  size_t in_stack_ffffffffffff7c68;
  char *in_stack_ffffffffffff7c70;
  undefined1 local_4388 [17216];
  int64_t local_48;
  long local_40;
  int64_t local_38;
  long local_30;
  long local_28;
  long local_18;
  long local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  if (in_RSI == 0) {
    local_8740 = 0;
  }
  else {
    local_8740 = __dynamic_cast(in_RSI,&TPZBaseMatrix::typeinfo,&TPZMatrix<double>::typeinfo,0);
  }
  if (local_8740 != 0) {
    if (local_18 == 0) {
      local_8750 = 0;
    }
    else {
      local_8750 = __dynamic_cast(local_18,&TPZBaseMatrix::typeinfo,&TPZFMatrix<double>::typeinfo,0)
      ;
    }
    if (local_8750 == 0) goto LAB_01db7fa8;
  }
  std::operator<<((ostream *)&std::cerr,
                  "virtual void TPZFrontStructMatrix<TPZFrontNonSym<double>>::Assemble(TPZBaseMatrix &, TPZBaseMatrix &, TPZAutoPointer<TPZGuiInterface>) [TFront = TPZFrontNonSym<double>, TVar = double, TPar = TPZStructMatrixOR<STATE>]"
                 );
  std::operator<<((ostream *)&std::cerr," incompatible types. Aborting...\n");
  pzinternal::DebugStopImpl(in_stack_ffffffffffff7c70,in_stack_ffffffffffff7c68);
LAB_01db7fa8:
  local_28 = __dynamic_cast(local_10,&TPZBaseMatrix::typeinfo,&TPZMatrix<double>::typeinfo,0);
  if (local_28 == 0) {
    __cxa_bad_cast();
  }
  local_30 = __dynamic_cast(local_18,&TPZBaseMatrix::typeinfo,&TPZFMatrix<double>::typeinfo,0);
  if (local_30 == 0) {
    __cxa_bad_cast();
  }
  local_40 = 0;
  local_48 = TPZCompMesh::NElements((TPZCompMesh *)0x1db803d);
  TPZElementMatrixT<double>::TPZElementMatrixT
            (in_stack_ffffffffffff7890,in_stack_ffffffffffff7888,
             (MType)((ulong)in_stack_ffffffffffff7880 >> 0x20));
  TPZElementMatrixT<double>::TPZElementMatrixT
            (in_stack_ffffffffffff7890,in_stack_ffffffffffff7888,
             (MType)((ulong)in_stack_ffffffffffff7880 >> 0x20));
  TPZCompMesh::ElementVec(*(TPZCompMesh **)(in_RDI + 8));
  this_00 = (TPZFrontStructMatrix<TPZFrontNonSym<double>,_double,_TPZStructMatrixOR<double>_> *)
            TPZCompMesh::NEquations(in_stack_ffffffffffff7880);
  TPZVec<int>::TPZVec(in_stack_ffffffffffff7860,in_stack_ffffffffffff7858,
                      (int *)in_stack_ffffffffffff7850);
  OrderElement(in_stack_ffffffffffff7bd0);
  local_38 = 0;
  do {
    if (local_48 <= local_38) {
      TPZVec<int>::~TPZVec((TPZVec<int> *)in_stack_ffffffffffff7850);
      TPZElementMatrixT<double>::~TPZElementMatrixT(in_stack_ffffffffffff7850);
      TPZElementMatrixT<double>::~TPZElementMatrixT(in_stack_ffffffffffff7850);
      return;
    }
    el_00 = (TPZCompEl *)TPZVec<int>::operator[]((TPZVec<int> *)(in_RDI + 0xa8),local_38);
    if (-1 < *(int *)el_00) {
      ekb = (TPZElementMatrix *)
            TPZChunkVector<TPZCompEl_*,_10>::operator[]
                      ((TPZChunkVector<TPZCompEl_*,_10> *)
                       CONCAT44(in_stack_ffffffffffff7874,in_stack_ffffffffffff7870),
                       (int64_t)in_stack_ffffffffffff7868);
      pTVar1 = (TPZCompEl *)ekb->_vptr_TPZElementMatrix;
      if (pTVar1 != (TPZCompEl *)0x0) {
        efb = (TPZElementMatrix *)(**(code **)(*(long *)pTVar1 + 0xb8))();
        if (efb != (TPZElementMatrix *)0x0) {
          in_stack_ffffffffffff7874 = (*efb->_vptr_TPZElementMatrix[0xb])();
          bVar2 = ::TPZStructMatrix::ShouldCompute
                            ((TPZStructMatrix *)
                             CONCAT44(in_stack_ffffffffffff7874,in_stack_ffffffffffff7870),
                             (int)((ulong)in_stack_ffffffffffff7868 >> 0x20));
          in_stack_ffffffffffff7870 = CONCAT13(bVar2,(int3)in_stack_ffffffffffff7870);
          if (!bVar2) goto LAB_01db83f5;
        }
        (**(code **)(*(long *)pTVar1 + 0x108))(pTVar1,local_4388,local_86c8);
        in_stack_ffffffffffff7868 =
             (TPZFMatrix<double> *)
             std::operator<<((ostream *)&std::cout," assemblando elemento frontal ");
        this_01 = (void *)std::ostream::operator<<(in_stack_ffffffffffff7868,local_38);
        std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
        AssembleElement(this_00,el_00,ekb,efb,
                        (TPZMatrix<double> *)
                        CONCAT44(in_stack_ffffffffffff7874,in_stack_ffffffffffff7870),
                        in_stack_ffffffffffff7868);
        if ((*(int *)(in_RDI + 200) == 0) &&
           (std::operator<<((ostream *)&std::cout,'*'), local_40 % 0x14 == 0)) {
          poVar3 = std::operator<<((ostream *)&std::cout," ");
          in_stack_ffffffffffff7850 =
               (TPZElementMatrixT<double> *)
               std::ostream::operator<<(poVar3,(local_38 * 100) / local_48);
          poVar3 = std::operator<<((ostream *)in_stack_ffffffffffff7850,"% Elements assembled ");
          std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
          std::ostream::flush();
        }
        local_40 = local_40 + 1;
      }
    }
LAB_01db83f5:
    local_38 = local_38 + 1;
  } while( true );
}

Assistant:

void TPZFrontStructMatrix<TFront,TVar,TPar>::Assemble(TPZBaseMatrix & stiff_base, TPZBaseMatrix & rhs_base, TPZAutoPointer<TPZGuiInterface> guiInterface){
    if(!dynamic_cast<TPZMatrix<TVar>*>(&stiff_base) ||
       dynamic_cast<TPZFMatrix<TVar>*>(&rhs_base)){
        PZError<<__PRETTY_FUNCTION__;
        PZError<<" incompatible types. Aborting...\n";
        DebugStop();
    }
	auto& stiffness = dynamic_cast<TPZMatrix<TVar>&>(stiff_base);
    auto& rhs = dynamic_cast<TPZFMatrix<TVar>&>(rhs_base);
	int64_t iel;
	int64_t numel = 0, nelem = this->fMesh->NElements();
	TPZElementMatrixT<TVar> ek(this->fMesh,TPZElementMatrix::EK),ef(this->fMesh,TPZElementMatrix::EF);
	
	TPZAdmChunkVector<TPZCompEl *> &elementvec = this->fMesh->ElementVec();
	
	
	/**Rearange elements order*/
	TPZVec<int> elorder(this->fMesh->NEquations(),0);
	
	OrderElement();
	
	for(iel=0; iel < nelem; iel++) {
		
        int64_t elindex = fElementOrder[iel];
		if(elindex < 0) continue;
		TPZCompEl *el = elementvec[elindex];
		if(!el) continue;
		TPZMaterial * mat = el->Material();
		if(mat)
		{
			int matid = mat->Id();
			if(this->ShouldCompute(matid) == false)
			{
				continue;
			}
		}
		else
		{
		}
		
		//		int dim = el->NumNodes();
		
		//Builds elements stiffness matrix
		el->CalcStiff(ek,ef);
		
		
		std::cout<< " assemblando elemento frontal " << iel <<std::endl;
		
#ifdef PZ_LOG
        if (logger.isDebugEnabled())
		{
			std::stringstream sout;
			ek.fMat.Print("Element stiffness Frontal",sout);
			LOGPZ_DEBUG(logger,sout.str())
		}
#endif
		
		AssembleElement(el, ek, ef, stiffness, rhs);
#ifdef PZ_LOG
		if(loggerel.isDebugEnabled())
		{
			std::stringstream sout;
			ek.fMat.Print("Element stiffness depois de assemblada ",sout);
			LOGPZ_DEBUG(loggerel,sout.str())
		}
#endif
		
		if(!f_quiet)
		{
			cout << '*';
			if(!(numel%20)) {
				cout << " " << (100*iel/nelem) << "% Elements assembled " << endl;
				cout.flush();
			}
		}
		numel++;
		
	}//fim for iel
	
}